

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

bool __thiscall CLI::App::check_name(App *this,string *name_to_check)

{
  string *psVar1;
  __type _Var2;
  bool bVar3;
  pointer pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> les;
  string local_name;
  string local_158;
  pointer local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  psVar1 = &this->name_;
  ::std::__cxx11::string::string((string *)&local_130,(string *)psVar1);
  if (this->ignore_underscore_ == true) {
    ::std::__cxx11::string::string((string *)&local_b0,(string *)psVar1);
    detail::remove_underscore(&local_158,&local_b0);
    ::std::__cxx11::string::operator=((string *)&local_130,(string *)&local_158);
    ::std::__cxx11::string::~string((string *)&local_158);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::string((string *)&local_d0,(string *)name_to_check);
    detail::remove_underscore(&local_158,&local_d0);
    ::std::__cxx11::string::operator=((string *)name_to_check,(string *)&local_158);
    ::std::__cxx11::string::~string((string *)&local_158);
    ::std::__cxx11::string::~string((string *)&local_d0);
  }
  if (this->ignore_case_ == true) {
    ::std::__cxx11::string::string((string *)&local_f0,(string *)psVar1);
    detail::to_lower(&local_158,&local_f0);
    ::std::__cxx11::string::operator=((string *)&local_130,(string *)&local_158);
    ::std::__cxx11::string::~string((string *)&local_158);
    ::std::__cxx11::string::~string((string *)&local_f0);
    ::std::__cxx11::string::string((string *)&local_110,(string *)name_to_check);
    detail::to_lower(&local_158,&local_110);
    ::std::__cxx11::string::operator=((string *)name_to_check,(string *)&local_158);
    ::std::__cxx11::string::~string((string *)&local_158);
    ::std::__cxx11::string::~string((string *)&local_110);
  }
  _Var2 = ::std::operator==(&local_130,name_to_check);
  bVar3 = true;
  if (!_Var2) {
    pbVar4 = (this->aliases_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_138 = (this->aliases_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    do {
      bVar3 = pbVar4 != local_138;
      if (pbVar4 == local_138) break;
      ::std::__cxx11::string::string((string *)&local_158,(string *)pbVar4);
      if (this->ignore_underscore_ == true) {
        ::std::__cxx11::string::string((string *)&local_70,(string *)&local_158);
        detail::remove_underscore(&local_50,&local_70);
        ::std::__cxx11::string::operator=((string *)&local_158,(string *)&local_50);
        ::std::__cxx11::string::~string((string *)&local_50);
        ::std::__cxx11::string::~string((string *)&local_70);
      }
      if (this->ignore_case_ == true) {
        ::std::__cxx11::string::string((string *)&local_90,(string *)&local_158);
        detail::to_lower(&local_50,&local_90);
        ::std::__cxx11::string::operator=((string *)&local_158,(string *)&local_50);
        ::std::__cxx11::string::~string((string *)&local_50);
        ::std::__cxx11::string::~string((string *)&local_90);
      }
      _Var2 = ::std::operator==(&local_158,name_to_check);
      ::std::__cxx11::string::~string((string *)&local_158);
      pbVar4 = pbVar4 + 1;
    } while (!_Var2);
  }
  ::std::__cxx11::string::~string((string *)&local_130);
  return bVar3;
}

Assistant:

bool check_name(std::string name_to_check) const {
        std::string local_name = name_;
        if(ignore_underscore_) {
            local_name = detail::remove_underscore(name_);
            name_to_check = detail::remove_underscore(name_to_check);
        }
        if(ignore_case_) {
            local_name = detail::to_lower(name_);
            name_to_check = detail::to_lower(name_to_check);
        }

        if(local_name == name_to_check) {
            return true;
        }
        for(auto les : aliases_) {
            if(ignore_underscore_) {
                les = detail::remove_underscore(les);
            }
            if(ignore_case_) {
                les = detail::to_lower(les);
            }
            if(les == name_to_check) {
                return true;
            }
        }
        return false;
    }